

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O0

void process_COM(int raw)

{
  uint uVar1;
  ushort **ppuVar2;
  int in_EDI;
  int lastch;
  int ch;
  uint length;
  uint local_10;
  int local_8;
  
  local_10 = 0;
  setlocale(0,"");
  uVar1 = read_2_bytes();
  if (1 < uVar1) {
    for (local_8 = uVar1 - 2; local_8 != 0; local_8 = local_8 + -1) {
      uVar1 = read_1_byte();
      if (in_EDI == 0) {
        if (uVar1 == 0xd) {
          printf("\n");
        }
        else if (uVar1 == 10) {
          if (local_10 != 0xd) {
            printf("\n");
          }
        }
        else if (uVar1 == 0x5c) {
          printf("\\\\");
        }
        else {
          ppuVar2 = __ctype_b_loc();
          if (((*ppuVar2)[(int)uVar1] & 0x4000) == 0) {
            printf("\\%03o",(ulong)uVar1);
          }
          else {
            putc(uVar1,_stdout);
          }
        }
      }
      else {
        putc(uVar1,_stdout);
      }
      local_10 = uVar1;
    }
    printf("\n");
    setlocale(0,"C");
    return;
  }
  fprintf(_stderr,"%s\n","Erroneous JPEG marker length");
  exit(1);
}

Assistant:

static void
process_COM(int raw)
{
  unsigned int length;
  int ch;
  int lastch = 0;

  /* Bill Allombert: set locale properly for isprint */
#ifdef HAVE_LOCALE_H
  setlocale(LC_CTYPE, "");
#endif

  /* Get the marker parameter length count */
  length = read_2_bytes();
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;

  while (length > 0) {
    ch = read_1_byte();
    if (raw) {
      putc(ch, stdout);
    /* Emit the character in a readable form.
     * Nonprintables are converted to \nnn form,
     * while \ is converted to \\.
     * Newlines in CR, CR/LF, or LF form will be printed as one newline.
     */
    } else if (ch == '\r') {
      printf("\n");
    } else if (ch == '\n') {
      if (lastch != '\r')
        printf("\n");
    } else if (ch == '\\') {
      printf("\\\\");
    } else if (isprint(ch)) {
      putc(ch, stdout);
    } else {
      printf("\\%03o", ch);
    }
    lastch = ch;
    length--;
  }
  printf("\n");

  /* Bill Allombert: revert to C locale */
#ifdef HAVE_LOCALE_H
  setlocale(LC_CTYPE, "C");
#endif
}